

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopTextWrapPos(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  value_type *pvVar3;
  float local_14;
  ImGuiWindow *window;
  
  pIVar2 = GetCurrentWindow();
  ImVector<float>::pop_back(&(pIVar2->DC).TextWrapPosStack);
  bVar1 = ImVector<float>::empty(&(pIVar2->DC).TextWrapPosStack);
  if (bVar1) {
    local_14 = -1.0;
  }
  else {
    pvVar3 = ImVector<float>::back(&(pIVar2->DC).TextWrapPosStack);
    local_14 = *pvVar3;
  }
  (pIVar2->DC).TextWrapPos = local_14;
  return;
}

Assistant:

void ImGui::PopTextWrapPos()
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.TextWrapPosStack.pop_back();
    window->DC.TextWrapPos = window->DC.TextWrapPosStack.empty() ? -1.0f : window->DC.TextWrapPosStack.back();
}